

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

bool absl::lts_20250127::anon_unknown_1::SafeAddRepHi(double a_hi,double b_hi,Duration *d)

{
  uint32_t lo;
  uint32_t in_EDX;
  double dVar1;
  Duration DVar2;
  HiRep local_d0;
  uint32_t local_c8;
  HiRep local_98;
  uint32_t local_90;
  HiRep local_50;
  uint32_t local_48;
  double c;
  Duration *d_local;
  double b_hi_local;
  double a_hi_local;
  
  dVar1 = a_hi + b_hi;
  if (dVar1 < 9.223372036854776e+18) {
    if (-9.223372036854776e+18 < dVar1) {
      DVar2.rep_hi_.hi_ = 0;
      DVar2.rep_hi_.lo_ = d->rep_lo_;
      DVar2.rep_lo_ = in_EDX;
      lo = time_internal::GetRepLo((time_internal *)d->rep_hi_,DVar2);
      DVar2 = time_internal::MakeDuration((long)dVar1,lo);
      local_d0 = DVar2.rep_hi_;
      local_c8 = DVar2.rep_lo_;
      d->rep_hi_ = local_d0;
      d->rep_lo_ = local_c8;
      a_hi_local._7_1_ = true;
    }
    else {
      DVar2 = InfiniteDuration();
      DVar2 = lts_20250127::operator-(DVar2);
      local_98 = DVar2.rep_hi_;
      local_90 = DVar2.rep_lo_;
      d->rep_hi_ = local_98;
      d->rep_lo_ = local_90;
      a_hi_local._7_1_ = false;
    }
  }
  else {
    DVar2 = InfiniteDuration();
    local_50 = DVar2.rep_hi_;
    local_48 = DVar2.rep_lo_;
    d->rep_hi_ = local_50;
    d->rep_lo_ = local_48;
    a_hi_local._7_1_ = false;
  }
  return a_hi_local._7_1_;
}

Assistant:

inline bool SafeAddRepHi(double a_hi, double b_hi, Duration* d) {
  double c = a_hi + b_hi;
  if (c >= static_cast<double>(kint64max)) {
    *d = InfiniteDuration();
    return false;
  }
  if (c <= static_cast<double>(kint64min)) {
    *d = -InfiniteDuration();
    return false;
  }
  *d = time_internal::MakeDuration(c, time_internal::GetRepLo(*d));
  return true;
}